

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * re2::SimplifyWalker::SimplifyRepeat(Regexp *re,int min,int max,ParseFlags f)

{
  Regexp *pRVar1;
  ostream *poVar2;
  undefined1 local_218 [420];
  ParseFlags local_74;
  Regexp *pRStack_70;
  int i_2;
  Regexp *suf;
  Regexp **ppRStack_60;
  int i_1;
  Regexp **nre_subs_1;
  Regexp *nre;
  Regexp **ppRStack_48;
  int i;
  Regexp **nre_subs;
  Regexp *local_30;
  Regexp *nre_1;
  int local_20;
  ParseFlags f_local;
  int max_local;
  int min_local;
  Regexp *re_local;
  
  nre_1._4_4_ = f;
  local_20 = max;
  f_local = min;
  _max_local = re;
  if (max == -1) {
    if (min == 0) {
      pRVar1 = Regexp::Incref(re);
      re_local = Regexp::Star(pRVar1,nre_1._4_4_);
    }
    else if (min == 1) {
      pRVar1 = Regexp::Incref(re);
      re_local = Regexp::Plus(pRVar1,nre_1._4_4_);
    }
    else {
      pRVar1 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar1,kRegexpConcat,nre_1._4_4_);
      local_30 = pRVar1;
      Regexp::AllocSub(pRVar1,f_local);
      ppRStack_48 = Regexp::sub(local_30);
      for (nre._4_4_ = 0; nre._4_4_ < (int)(f_local - FoldCase); nre._4_4_ = nre._4_4_ + 1) {
        pRVar1 = Regexp::Incref(_max_local);
        ppRStack_48[nre._4_4_] = pRVar1;
      }
      pRVar1 = Regexp::Incref(_max_local);
      pRVar1 = Regexp::Plus(pRVar1,nre_1._4_4_);
      ppRStack_48[(int)(f_local - FoldCase)] = pRVar1;
      re_local = local_30;
    }
  }
  else if ((min == 0) && (max == 0)) {
    pRVar1 = (Regexp *)operator_new(0x28);
    Regexp::Regexp(pRVar1,kRegexpEmptyMatch,nre_1._4_4_);
    re_local = pRVar1;
  }
  else if ((min == 1) && (max == 1)) {
    re_local = Regexp::Incref(re);
  }
  else {
    nre_subs_1 = (Regexp **)0x0;
    if (0 < min) {
      pRVar1 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar1,kRegexpConcat,nre_1._4_4_);
      nre_subs_1 = (Regexp **)pRVar1;
      Regexp::AllocSub(pRVar1,f_local);
      ppRStack_60 = Regexp::sub((Regexp *)nre_subs_1);
      for (suf._4_4_ = 0; suf._4_4_ < (int)f_local; suf._4_4_ = suf._4_4_ + 1) {
        pRVar1 = Regexp::Incref(_max_local);
        ppRStack_60[suf._4_4_] = pRVar1;
      }
    }
    if ((int)f_local < local_20) {
      pRVar1 = Regexp::Incref(_max_local);
      pRStack_70 = Regexp::Quest(pRVar1,nre_1._4_4_);
      local_74 = f_local;
      while (local_74 = local_74 + FoldCase, (int)local_74 < local_20) {
        pRVar1 = Regexp::Incref(_max_local);
        pRVar1 = Concat2(pRVar1,pRStack_70,nre_1._4_4_);
        pRStack_70 = Regexp::Quest(pRVar1,nre_1._4_4_);
      }
      if (nre_subs_1 == (Regexp **)0x0) {
        nre_subs_1 = (Regexp **)pRStack_70;
      }
      else {
        nre_subs_1 = (Regexp **)Concat2((Regexp *)nre_subs_1,pRStack_70,nre_1._4_4_);
      }
    }
    if (nre_subs_1 == (Regexp **)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)(local_218 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/simplify.cc",
                 0x277);
      poVar2 = LogMessage::stream((LogMessage *)(local_218 + 0x20));
      poVar2 = std::operator<<(poVar2,"Malformed repeat ");
      Regexp::ToString_abi_cxx11_((Regexp *)local_218);
      poVar2 = std::operator<<(poVar2,(string *)local_218);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,f_local);
      poVar2 = std::operator<<(poVar2," ");
      std::ostream::operator<<(poVar2,local_20);
      std::__cxx11::string::~string((string *)local_218);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)(local_218 + 0x20));
      pRVar1 = (Regexp *)operator_new(0x28);
      Regexp::Regexp(pRVar1,kRegexpNoMatch,nre_1._4_4_);
      re_local = pRVar1;
    }
    else {
      re_local = (Regexp *)nre_subs_1;
    }
  }
  return re_local;
}

Assistant:

Regexp* SimplifyWalker::SimplifyRepeat(Regexp* re, int min, int max,
                                       Regexp::ParseFlags f) {
  // x{n,} means at least n matches of x.
  if (max == -1) {
    // Special case: x{0,} is x*
    if (min == 0)
      return Regexp::Star(re->Incref(), f);

    // Special case: x{1,} is x+
    if (min == 1)
      return Regexp::Plus(re->Incref(), f);

    // General case: x{4,} is xxxx+
    Regexp* nre = new Regexp(kRegexpConcat, f);
    nre->AllocSub(min);
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < min-1; i++)
      nre_subs[i] = re->Incref();
    nre_subs[min-1] = Regexp::Plus(re->Incref(), f);
    return nre;
  }

  // Special case: (x){0} matches only empty string.
  if (min == 0 && max == 0)
    return new Regexp(kRegexpEmptyMatch, f);

  // Special case: x{1} is just x.
  if (min == 1 && max == 1)
    return re->Incref();

  // General case: x{n,m} means n copies of x and m copies of x?.
  // The machine will do less work if we nest the final m copies,
  // so that x{2,5} = xx(x(x(x)?)?)?

  // Build leading prefix: xx.  Capturing only on the last one.
  Regexp* nre = NULL;
  if (min > 0) {
    nre = new Regexp(kRegexpConcat, f);
    nre->AllocSub(min);
    Regexp** nre_subs = nre->sub();
    for (int i = 0; i < min; i++)
      nre_subs[i] = re->Incref();
  }

  // Build and attach suffix: (x(x(x)?)?)?
  if (max > min) {
    Regexp* suf = Regexp::Quest(re->Incref(), f);
    for (int i = min+1; i < max; i++)
      suf = Regexp::Quest(Concat2(re->Incref(), suf, f), f);
    if (nre == NULL)
      nre = suf;
    else
      nre = Concat2(nre, suf, f);
  }

  if (nre == NULL) {
    // Some degenerate case, like min > max, or min < max < 0.
    // This shouldn't happen, because the parser rejects such regexps.
    LOG(DFATAL) << "Malformed repeat " << re->ToString() << " " << min << " " << max;
    return new Regexp(kRegexpNoMatch, f);
  }

  return nre;
}